

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrapTCPService.cpp
# Opt level: O1

PTR brynet::net::TCPSession::Create(void)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  PTR PVar2;
  
  peVar1 = (element_type *)operator_new(0xb0);
  (peVar1->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar1->_vptr_TcpService = (_func_int **)&PTR___Sp_counted_ptr_inplace_00147e58;
  this = &(peVar1->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
          super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  memset(this,0,0xa0);
  TCPSession((TCPSession *)this);
  (peVar1->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__TCPSession_00147ea8;
  in_RDI->_vptr_TCPSession = (_func_int **)this;
  (in_RDI->mService).super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  PVar2.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (PTR)PVar2.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TCPSession::PTR TCPSession::Create()
{
    struct make_shared_enabler : public TCPSession {};
    return std::make_shared<make_shared_enabler>();
}